

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O1

IterateResult __thiscall deqp::gls::RandomShaderCase::iterate(RandomShaderCase *this)

{
  ostringstream *poVar1;
  Type TVar2;
  TextureFormat log;
  RenderContext *pRVar3;
  ShaderInput *pSVar4;
  MessageBuilder *message;
  pointer pSVar5;
  Variable *pVVar6;
  Texture2D *pTVar7;
  TextureCube *pTVar8;
  pointer indices;
  bool bVar9;
  int iVar10;
  int iVar11;
  deUint32 dVar12;
  GLenum GVar13;
  GLuint index;
  GLint location;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar14;
  _Base_ptr p_Var15;
  TestError *this_00;
  Scalar *pSVar16;
  uint *puVar17;
  uint x;
  uint y;
  char *pcVar18;
  ChannelOrder CVar19;
  long lVar20;
  pointer pVVar21;
  _Rb_tree_header *p_Var22;
  pair<int,_const_glu::Texture2D_*> *ppVar23;
  pair<int,_const_glu::TextureCube_*> *ppVar24;
  pointer pVVar25;
  _Self __tmp;
  ConstValueAccess value;
  ConstValueAccess value_00;
  ConstValueAccess value_01;
  vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  texCubeBindings;
  vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
  tex2DBindings;
  TextureLevel rendered;
  Random rnd;
  TextureLevel reference;
  ProgramSources sources;
  ProgramExecutor executor;
  ShaderProgram program;
  pair<int,_const_glu::TextureCube_*> *local_418;
  iterator iStack_410;
  pair<int,_const_glu::TextureCube_*> *local_408;
  pair<int,_const_glu::Texture2D_*> *local_3f8;
  iterator iStack_3f0;
  pair<int,_const_glu::Texture2D_*> *local_3e8;
  int local_3d8;
  int local_3d4;
  undefined1 local_3d0 [40];
  Shader *local_3a8;
  Shader *local_3a0;
  ConstPixelBufferAccess local_398;
  deRandom local_370;
  TextureLevel local_360;
  undefined1 local_338 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320 [4];
  ios_base local_2c0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2a8;
  undefined1 local_288 [208];
  undefined1 local_1b8 [144];
  ConstPixelBufferAccess local_128;
  ShaderProgram local_100;
  
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  pRVar3 = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,(this->m_vertexShader).m_source._M_dataplus._M_p,
             (allocator<char> *)&local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3d0,(this->m_fragmentShader).m_source._M_dataplus._M_p,
             (allocator<char> *)&local_398);
  local_288[0x10] = 0;
  local_288._17_8_ = 0;
  local_288._0_8_ = (pointer)0x0;
  local_288[8] = 0;
  local_288._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_338,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_338,(value_type *)local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_320,(value_type *)local_3d0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar3,(ProgramSources *)local_338);
  local_3a0 = &this->m_fragmentShader;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_288);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2a8);
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_338 + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  glu::operator<<((TestLog *)log,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Failed to compile shader");
  }
  else {
    deRandom_init(&local_370,(this->m_parameters).seed);
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = *(int *)CONCAT44(extraout_var,iVar10);
    if (0x3f < iVar10) {
      iVar10 = 0x40;
    }
    iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar11 = *(int *)(CONCAT44(extraout_var_00,iVar11) + 4);
    local_3d8 = 0x40;
    if (iVar11 < 0x40) {
      local_3d8 = iVar11;
    }
    iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar11 = *(int *)CONCAT44(extraout_var_01,iVar11);
    dVar12 = deRandom_getUint32(&local_370);
    x = dVar12 % ((iVar11 - iVar10) + 1U);
    iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar11 = *(int *)(CONCAT44(extraout_var_02,iVar11) + 4);
    dVar12 = deRandom_getUint32(&local_370);
    y = dVar12 % ((iVar11 - local_3d8) + 1U);
    iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    CVar19 = (0 < *(int *)(CONCAT44(extraout_var_03,iVar11) + 0x14)) + RGB;
    local_338._4_4_ = UNORM_INT8;
    local_338._0_4_ = CVar19;
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_3d0,(TextureFormat *)local_338,iVar10,local_3d8,1);
    local_338._4_4_ = UNORM_INT8;
    tcu::TextureLevel::TextureLevel(&local_360,(TextureFormat *)local_338,iVar10,local_3d8,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_338,&local_360);
    rsg::ProgramExecutor::ProgramExecutor
              ((ProgramExecutor *)local_1b8,(PixelBufferAccess *)local_338,this->m_gridWidth,
               this->m_gridHeight);
    local_3a8 = &this->m_vertexShader;
    glwUseProgram(local_100.m_program.m_program);
    GVar13 = glwGetError();
    pSVar16 = (Scalar *)0x1e6;
    glu::checkError(GVar13,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x1e6);
    pVVar21 = (this->m_vertexArrays).
              super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_3d4 = iVar10;
    if (pVVar21 !=
        (this->m_vertexArrays).
        super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar1 = (ostringstream *)(local_338 + 8);
      do {
        index = glwGetAttribLocation
                          (local_100.m_program.m_program,
                           (pVVar21->m_input->m_variable->m_name)._M_dataplus._M_p);
        local_338._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"attribute[",10);
        std::ostream::operator<<(poVar1,index);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]: ",3);
        pcVar18 = (pVVar21->m_input->m_variable->m_name)._M_dataplus._M_p;
        if (pcVar18 == (char *)0x0) {
          std::ios::clear((int)poVar1 +
                          (int)(((TextureCube *)(local_338._8_8_ + -0x180))->m_refTexture).m_view.
                               m_levels[4]);
        }
        else {
          sVar14 = strlen(pcVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar18,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        pSVar4 = pVVar21->m_input;
        message = (MessageBuilder *)pSVar4->m_variable;
        pSVar5 = (pSVar4->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        value.m_value = pSVar16;
        value.m_type = (VariableType *)
                       (pSVar4->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        anon_unknown_5::operator<<((anon_unknown_5 *)local_338,message,value);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," -> ",4);
        value_00.m_value = pSVar16;
        value_00.m_type = (VariableType *)pSVar5;
        anon_unknown_5::operator<<((anon_unknown_5 *)local_338,message,value_00);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_2c0);
        if (-1 < (int)index) {
          pSVar16 = (Scalar *)0x0;
          glwVertexAttribPointer
                    (index,(pVVar21->m_input->m_variable->m_type).m_numElements,0x1406,'\0',0,
                     (pVVar21->m_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start);
          glwEnableVertexAttribArray(index);
        }
        pVVar21 = pVVar21 + 1;
      } while (pVVar21 !=
               (this->m_vertexArrays).
               super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    GVar13 = glwGetError();
    puVar17 = (uint *)0x1f6;
    glu::checkError(GVar13,"After attribute setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x1f6);
    pVVar25 = (this->m_uniforms).
              super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pVVar25 !=
        (this->m_uniforms).
        super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar1 = (ostringstream *)(local_338 + 8);
      do {
        location = glwGetUniformLocation
                             (local_100.m_program.m_program,
                              (pVVar25->m_variable->m_name)._M_dataplus._M_p);
        local_338._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"uniform[",8);
        std::ostream::operator<<(poVar1,location);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]: ",3);
        pcVar18 = (pVVar25->m_variable->m_name)._M_dataplus._M_p;
        if (pcVar18 == (char *)0x0) {
          std::ios::clear((int)(((TextureCube *)(local_338._8_8_ + -0x180))->m_refTexture).m_view.
                               m_levels[4] + (int)poVar1);
        }
        else {
          sVar14 = strlen(pcVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar18,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        value_01.m_value = (Scalar *)puVar17;
        value_01.m_type =
             (VariableType *)
             (pVVar25->m_storage).m_value.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        anon_unknown_5::operator<<
                  ((anon_unknown_5 *)local_338,(MessageBuilder *)pVVar25->m_variable,value_01);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_2c0);
        if (-1 < location) {
          pVVar6 = pVVar25->m_variable;
          TVar2 = (pVVar6->m_type).m_baseType;
          if (TYPE_SAMPLER_CUBE < TVar2) {
LAB_0048f034:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unsupported type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                       ,0x194);
LAB_0048f08c:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          pSVar5 = (pVVar25->m_storage).m_value.
                   super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((0xccU >> (TVar2 & 0x1f) & 1) == 0) {
            if (TVar2 != TYPE_FLOAT) goto LAB_0048f034;
            puVar17 = &switchD_0048ea97::switchdataD_00682864;
            switch((pVVar6->m_type).m_numElements) {
            case 1:
              glwUniform1fv(location,1,&pSVar5->floatVal);
              break;
            case 2:
              glwUniform2fv(location,1,&pSVar5->floatVal);
              break;
            case 3:
              glwUniform3fv(location,1,&pSVar5->floatVal);
              break;
            case 4:
              glwUniform4fv(location,1,&pSVar5->floatVal);
              break;
            default:
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Unsupported type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                         ,0x181);
              goto LAB_0048f08c;
            }
          }
          else {
            puVar17 = &switchD_0048ea5e::switchdataD_00682854;
            switch((pVVar6->m_type).m_numElements) {
            case 1:
              glwUniform1iv(location,1,&pSVar5->intVal);
              break;
            case 2:
              glwUniform2iv(location,1,&pSVar5->intVal);
              break;
            case 3:
              glwUniform3iv(location,1,&pSVar5->intVal);
              break;
            case 4:
              glwUniform4iv(location,1,&pSVar5->intVal);
              break;
            default:
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Unsupported type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                         ,399);
              goto LAB_0048f08c;
            }
          }
        }
        pVVar25 = pVVar25 + 1;
      } while (pVVar25 !=
               (this->m_uniforms).
               super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    GVar13 = glwGetError();
    glu::checkError(GVar13,"After uniform setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x202);
    local_3f8 = (pair<int,_const_glu::Texture2D_*> *)0x0;
    iStack_3f0._M_current = (pair<int,_const_glu::Texture2D_*> *)0x0;
    local_3e8 = (pair<int,_const_glu::Texture2D_*> *)0x0;
    p_Var15 = (this->m_texManager).m_tex2D._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var22 = &(this->m_texManager).m_tex2D._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var15 != p_Var22) {
      do {
        local_338._0_4_ = p_Var15[1]._M_color;
        local_338._8_8_ = p_Var15[1]._M_parent;
        if (iStack_3f0._M_current == local_3e8) {
          std::
          vector<std::pair<int,glu::Texture2D_const*>,std::allocator<std::pair<int,glu::Texture2D_const*>>>
          ::_M_realloc_insert<std::pair<int,glu::Texture2D_const*>>
                    ((vector<std::pair<int,glu::Texture2D_const*>,std::allocator<std::pair<int,glu::Texture2D_const*>>>
                      *)&local_3f8,iStack_3f0,(pair<int,_const_glu::Texture2D_*> *)local_338);
        }
        else {
          *(undefined8 *)iStack_3f0._M_current = local_338._0_8_;
          (iStack_3f0._M_current)->second = (Texture2D *)local_338._8_8_;
          iStack_3f0._M_current = iStack_3f0._M_current + 1;
        }
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)p_Var15 != p_Var22);
    }
    local_418 = (pair<int,_const_glu::TextureCube_*> *)0x0;
    iStack_410._M_current = (pair<int,_const_glu::TextureCube_*> *)0x0;
    local_408 = (pair<int,_const_glu::TextureCube_*> *)0x0;
    p_Var15 = (this->m_texManager).m_texCube._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var22 = &(this->m_texManager).m_texCube._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var15 != p_Var22) {
      do {
        local_338._0_4_ = p_Var15[1]._M_color;
        local_338._8_8_ = p_Var15[1]._M_parent;
        if (iStack_410._M_current == local_408) {
          std::
          vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>
          ::_M_realloc_insert<std::pair<int,glu::TextureCube_const*>>
                    ((vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>
                      *)&local_418,iStack_410,(pair<int,_const_glu::TextureCube_*> *)local_338);
        }
        else {
          *(undefined8 *)iStack_410._M_current = local_338._0_8_;
          (iStack_410._M_current)->second = (TextureCube *)local_338._8_8_;
          iStack_410._M_current = iStack_410._M_current + 1;
        }
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)p_Var15 != p_Var22);
    }
    if (local_3f8 != iStack_3f0._M_current) {
      ppVar23 = local_3f8;
      do {
        iVar10 = ppVar23->first;
        pTVar7 = ppVar23->second;
        glwActiveTexture(iVar10 + 0x84c0);
        glwBindTexture(0xde1,pTVar7->m_glTexture);
        glu::mapGLSampler((Sampler *)local_338,0x812f,0x812f,0x2601,0x2601);
        rsg::ProgramExecutor::setTexture
                  ((ProgramExecutor *)local_1b8,iVar10,&pTVar7->m_refTexture,(Sampler *)local_338);
        ppVar23 = ppVar23 + 1;
      } while (ppVar23 != iStack_3f0._M_current);
    }
    GVar13 = glwGetError();
    glu::checkError(GVar13,"After 2D texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x212);
    if (local_418 != iStack_410._M_current) {
      ppVar24 = local_418;
      do {
        iVar10 = ppVar24->first;
        pTVar8 = ppVar24->second;
        glwActiveTexture(iVar10 + 0x84c0);
        glwBindTexture(0x8513,pTVar8->m_glTexture);
        glu::mapGLSampler((Sampler *)local_338,0x812f,0x812f,0x2601,0x2601);
        rsg::ProgramExecutor::setTexture
                  ((ProgramExecutor *)local_1b8,iVar10,&pTVar8->m_refTexture,(Sampler *)local_338);
        ppVar24 = ppVar24 + 1;
      } while (ppVar24 != iStack_410._M_current);
    }
    GVar13 = glwGetError();
    glu::checkError(GVar13,"After cubemap setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x21e);
    glwViewport(x,y,local_3d4,local_3d8);
    indices = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    glwDrawElements(4,(GLsizei)((ulong)((long)(this->m_indices).
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)indices) >> 1),0x1403,indices);
    glwFlush();
    GVar13 = glwGetError();
    glu::checkError(GVar13,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x224);
    rsg::ProgramExecutor::execute
              ((ProgramExecutor *)local_1b8,local_3a8,local_3a0,&this->m_uniforms);
    if ((TextureFormat)local_3d0._0_8_ == (TextureFormat)0x300000008) {
      pRVar3 = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_338,(TextureLevel *)local_3d0);
      glu::readPixels(pRVar3,x,y,(PixelBufferAccess *)local_338);
    }
    else {
      local_398.m_format.order = RGBA;
      local_398.m_format.type = UNORM_INT8;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)local_338,&local_398.m_format,local_3d0._8_4_,local_3d0._12_4_,1);
      pRVar3 = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_398,(TextureLevel *)local_338);
      glu::readPixels(pRVar3,x,y,(PixelBufferAccess *)&local_398);
      GVar13 = glwGetError();
      glu::checkError(GVar13,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                      ,0x22e);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_398,(TextureLevel *)local_3d0);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_128,(TextureLevel *)local_338);
      tcu::copy((EVP_PKEY_CTX *)&local_398,(EVP_PKEY_CTX *)&local_128);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_338);
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_338,&local_360);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_398,(TextureLevel *)local_3d0);
    bVar9 = tcu::fuzzyCompare((TestLog *)log,"Result","Result images",
                              (ConstPixelBufferAccess *)local_338,&local_398,0.02,COMPARE_LOG_RESULT
                             );
    pcVar18 = "Image comparison failed";
    if (bVar9) {
      pcVar18 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar9,pcVar18);
    if (local_418 != (pair<int,_const_glu::TextureCube_*> *)0x0) {
      operator_delete(local_418,(long)local_408 - (long)local_418);
    }
    if (local_3f8 != (pair<int,_const_glu::Texture2D_*> *)0x0) {
      operator_delete(local_3f8,(long)local_3e8 - (long)local_3f8);
    }
    rsg::ProgramExecutor::~ProgramExecutor((ProgramExecutor *)local_1b8);
    tcu::TextureLevel::~TextureLevel(&local_360);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_3d0);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return STOP;
}

Assistant:

RandomShaderCase::IterateResult RandomShaderCase::iterate (void)
{
	tcu::TestLog& log = m_testCtx.getLog();

	// Compile program
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexShader.getSource(), m_fragmentShader.getSource()));
	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
		return STOP;
	}

	// Compute random viewport
	de::Random				rnd				(m_parameters.seed);
	int						viewportWidth	= de::min<int>(VIEWPORT_WIDTH,	m_renderCtx.getRenderTarget().getWidth());
	int						viewportHeight	= de::min<int>(VIEWPORT_HEIGHT,	m_renderCtx.getRenderTarget().getHeight());
	int						viewportX		= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth()	- viewportWidth);
	int						viewportY		= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportHeight);
	bool					hasAlpha		= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	tcu::TextureLevel		rendered		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);
	tcu::TextureLevel		reference		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);

	// Reference program executor.
	rsg::ProgramExecutor	executor		(reference.getAccess(), m_gridWidth, m_gridHeight);

	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	// Set up attributes
	for (vector<VertexArray>::const_iterator attribIter = m_vertexArrays.begin(); attribIter != m_vertexArrays.end(); attribIter++)
	{
		GLint location = glGetAttribLocation(program.getProgram(), attribIter->getName());

		// Print to log.
		log << tcu::TestLog::Message << "attribute[" << location << "]: " << attribIter->getName() << " = " << attribIter->getValueRange() << tcu::TestLog::EndMessage;

		if (location >= 0)
		{
			glVertexAttribPointer(location, attribIter->getNumComponents(), GL_FLOAT, GL_FALSE, 0, &attribIter->getVertices()[0]);
			glEnableVertexAttribArray(location);
		}
	}
	GLU_CHECK_MSG("After attribute setup");

	// Uniforms
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		GLint location = glGetUniformLocation(program.getProgram(), uniformIter->getVariable()->getName());

		log << tcu::TestLog::Message << "uniform[" << location << "]: " << uniformIter->getVariable()->getName() << " = " << uniformIter->getValue() << tcu::TestLog::EndMessage;

		if (location >= 0)
			setUniformValue(location, uniformIter->getValue());
	}
	GLU_CHECK_MSG("After uniform setup");

	// Textures
	vector<pair<int, const glu::Texture2D*> >	tex2DBindings		= m_texManager.getBindings2D();
	vector<pair<int, const glu::TextureCube*> >	texCubeBindings		= m_texManager.getBindingsCube();

	for (vector<pair<int, const glu::Texture2D*> >::const_iterator i = tex2DBindings.begin(); i != tex2DBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::Texture2D*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_2D, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After 2D texture setup");

	for (vector<pair<int, const glu::TextureCube*> >::const_iterator i = texCubeBindings.begin(); i != texCubeBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::TextureCube*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_CUBE_MAP, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After cubemap setup");

	// Draw and read
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, (GLsizei)m_indices.size(), GL_UNSIGNED_SHORT, &m_indices[0]);
	glFlush();
	GLU_CHECK_MSG("Draw");

	// Render reference while GPU is doing work
	executor.execute(m_vertexShader, m_fragmentShader, m_uniforms);

	if (rendered.getFormat().order != tcu::TextureFormat::RGBA || rendered.getFormat().type != tcu::TextureFormat::UNORM_INT8)
	{
		// Read as GL_RGBA8
		tcu::TextureLevel readBuf(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), rendered.getWidth(), rendered.getHeight());
		glu::readPixels(m_renderCtx, viewportX, viewportY, readBuf.getAccess());
		GLU_CHECK_MSG("Read pixels");
		tcu::copy(rendered, readBuf);
	}
	else
		glu::readPixels(m_renderCtx, viewportX, viewportY, rendered.getAccess());

	// Compare
	{
		float	threshold	= 0.02f;
		bool	imagesOk	= tcu::fuzzyCompare(log, "Result", "Result images", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}